

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::
basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
::write_padded<fmt::v6::internal::nonfinite_writer<char>>
          (basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
           *this,format_specs *specs,nonfinite_writer<char> *f)

{
  byte bVar1;
  undefined2 uVar2;
  undefined8 *puVar3;
  long lVar4;
  byte bVar5;
  size_t size;
  undefined2 *__s;
  undefined2 *puVar6;
  ulong uVar7;
  ulong uVar8;
  buffer<char> *c;
  ulong uVar9;
  char __tmp;
  size_t __len;
  size_t __n;
  
  uVar7 = (ulong)(uint)specs->width;
  uVar8 = 4 - (ulong)(f->sign == none);
  puVar3 = *(undefined8 **)this;
  lVar4 = puVar3[2];
  __n = uVar7 - uVar8;
  if (uVar7 < uVar8 || __n == 0) {
    uVar8 = uVar8 + lVar4;
    if ((ulong)puVar3[3] < uVar8) {
      (**(code **)*puVar3)(puVar3,uVar8);
    }
    puVar3[2] = uVar8;
    puVar6 = (undefined2 *)(lVar4 + puVar3[1]);
LAB_0014dfe0:
    if ((ulong)f->sign != 0) {
      *(undefined1 *)puVar6 = *(undefined1 *)((long)&basic_data<void>::signs + (ulong)f->sign);
      puVar6 = (undefined2 *)((long)puVar6 + 1);
    }
    uVar2 = *(undefined2 *)f->str;
    *(char *)(puVar6 + 1) = f->str[2];
    *puVar6 = uVar2;
    return;
  }
  uVar9 = lVar4 + uVar7;
  if ((ulong)puVar3[3] < uVar9) {
    (**(code **)*puVar3)(puVar3,uVar9);
  }
  puVar3[2] = uVar9;
  __s = (undefined2 *)(lVar4 + puVar3[1]);
  bVar1 = (specs->fill).data_[0];
  bVar5 = specs->field_0x9 & 0xf;
  if (bVar5 == 3) {
    uVar9 = __n >> 1;
    if (1 < __n) {
      memset(__s,(uint)bVar1,uVar9);
      __s = (undefined2 *)((long)__s + uVar9);
    }
    if ((ulong)f->sign != 0) {
      *(undefined1 *)__s = *(undefined1 *)((long)&basic_data<void>::signs + (ulong)f->sign);
      __s = (undefined2 *)((long)__s + 1);
    }
    uVar2 = *(undefined2 *)f->str;
    *(char *)(__s + 1) = f->str[2];
    *__s = uVar2;
    if (uVar7 == uVar8) {
      return;
    }
    __n = __n - uVar9;
  }
  else {
    if (bVar5 == 2) {
      puVar6 = __s;
      if (uVar7 != uVar8) {
        puVar6 = (undefined2 *)((long)__s + __n);
        memset(__s,(uint)bVar1,__n);
      }
      goto LAB_0014dfe0;
    }
    if ((ulong)f->sign != 0) {
      *(undefined1 *)__s = *(undefined1 *)((long)&basic_data<void>::signs + (ulong)f->sign);
      __s = (undefined2 *)((long)__s + 1);
    }
    uVar2 = *(undefined2 *)f->str;
    *(char *)(__s + 1) = f->str[2];
    *__s = uVar2;
    if (uVar7 == uVar8) {
      return;
    }
  }
  memset((undefined1 *)((long)__s + 3),(uint)bVar1,__n);
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    auto&& it = reserve(width + (size - num_code_points));
    char_type fill = specs.fill[0];
    std::size_t padding = width - num_code_points;
    if (specs.align == align::right) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }